

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMethodList *stm)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  allocator local_b9;
  string local_b8 [32];
  vector<INode_*,_std::allocator<INode_*>_> local_98;
  ChildrenAnswers local_80;
  pointer local_40;
  int local_34;
  undefined1 local_30 [4];
  int index;
  vector<INode_*,_std::allocator<INode_*>_> children;
  CMethodList *stm_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)stm;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  local_34 = 0;
  while( true ) {
    uVar1 = (ulong)local_34;
    sVar2 = std::
            vector<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
            ::size((vector<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
                    *)(children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    if (sVar2 <= uVar1) break;
    this_00 = std::
              vector<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
              ::operator[]((vector<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
                            *)(children.super__Vector_base<INode_*,_std::allocator<INode_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 3),(long)local_34
                          );
    local_40 = std::unique_ptr<CMethod,_std::default_delete<CMethod>_>::get(this_00);
    std::vector<INode_*,_std::allocator<INode_*>_>::push_back
              ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,(value_type *)&local_40);
    local_34 = local_34 + 1;
  }
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&local_98,(vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren(&local_80,this,&local_98);
  AddChildrenAnswers(this,&local_80);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&local_80);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector(&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"MethodList",&local_b9);
  AddLabel(this,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  this->lastVisited = this->lastVisited + 1;
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CMethodList &stm) {
	std::vector<INode*> children;
	for (int index = 0; index < stm.methods.size(); ++index) {
		children.push_back(stm.methods[index].get());
	}
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("MethodList");
	++lastVisited;
}